

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

void __thiscall
google::
dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
::clear_no_resize(dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *this)

{
  pointer ppcVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  long lVar9;
  
  auVar3 = _DAT_00a8f670;
  if (this->num_elements == 0) {
    uVar4 = this->num_buckets;
  }
  else {
    uVar4 = this->num_buckets;
    if (uVar4 == 0) {
      uVar4 = 0;
    }
    else {
      ppcVar1 = this->table;
      pcVar2 = (this->key_info).empty_key;
      lVar9 = uVar4 - 1;
      auVar6._8_4_ = (int)lVar9;
      auVar6._0_8_ = lVar9;
      auVar6._12_4_ = (int)((ulong)lVar9 >> 0x20);
      uVar5 = 0;
      auVar6 = auVar6 ^ _DAT_00a8f670;
      auVar8 = _DAT_00a8f660;
      do {
        auVar10 = auVar8 ^ auVar3;
        if ((bool)(~(auVar10._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar10._0_4_ ||
                    auVar6._4_4_ < auVar10._4_4_) & 1)) {
          ppcVar1[uVar5] = pcVar2;
        }
        if ((auVar10._12_4_ != auVar6._12_4_ || auVar10._8_4_ <= auVar6._8_4_) &&
            auVar10._12_4_ <= auVar6._12_4_) {
          ppcVar1[uVar5 + 1] = pcVar2;
        }
        uVar5 = uVar5 + 2;
        lVar9 = auVar8._8_8_;
        auVar8._0_8_ = auVar8._0_8_ + 2;
        auVar8._8_8_ = lVar9 + 2;
      } while ((uVar4 + 1 & 0xfffffffffffffffe) != uVar5);
    }
  }
  fVar7 = (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
          enlarge_factor_ * (float)uVar4;
  uVar5 = (ulong)fVar7;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  enlarge_threshold_ = (long)(fVar7 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
  fVar7 = (float)uVar4 *
          (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
          shrink_factor_;
  uVar4 = (ulong)fVar7;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  shrink_threshold_ = (long)(fVar7 - 9.223372e+18) & (long)uVar4 >> 0x3f | uVar4;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  consider_shrink_ = false;
  this->num_deleted = 0;
  this->num_elements = 0;
  return;
}

Assistant:

void clear_no_resize() {
    if (num_elements > 0) {
      assert(table);
      destroy_buckets(0, num_buckets);
      fill_range_with_empty(table, num_buckets);
    }
    // don't consider to shrink before another erase()
    settings.reset_thresholds(bucket_count());
    num_elements = 0;
    num_deleted = 0;
  }